

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O1

void OpenSteer::
     mapPointToPathAlike<OpenSteer::PolylineSegmentedPathwaySegmentRadii,(anonymous_namespace)::PointToSegmentIndexMapping>
               (PolylineSegmentedPathwaySegmentRadii *pathAlike,Vec3 *point,
               PointToSegmentIndexMapping *mapping)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float radius;
  float segmentDistance;
  float local_64;
  undefined8 local_60;
  float local_58;
  float local_50 [2];
  PointToSegmentIndexMapping *local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_48 = mapping;
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    local_64 = 3.4028235e+38;
    sVar2 = 0;
    do {
      local_50[1] = 0.0;
      local_50[0] = 0.0;
      local_60 = 0;
      local_58 = 0.0;
      local_40 = 0;
      local_38 = 0;
      (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x13])
                (pathAlike,sVar2,point,local_50 + 1,&local_60,&local_40,local_50);
      fVar4 = point->x - (float)local_60;
      fVar5 = point->y - local_60._4_4_;
      fVar3 = point->z - local_58;
      fVar3 = fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar3 = fVar3 - local_50[0];
      if (fVar3 < local_64) {
        fVar5 = point->x - (float)local_60;
        fVar6 = point->y - local_60._4_4_;
        fVar4 = point->z - local_58;
        fVar4 = fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6;
        if (fVar4 < 0.0) {
          sqrtf(fVar4);
        }
        local_48->segmentIndex = sVar2;
        local_64 = fVar3;
      }
      (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])(pathAlike,sVar2);
      sVar2 = sVar2 + 1;
    } while (CONCAT44(extraout_var,iVar1) != sVar2);
  }
  return;
}

Assistant:

void mapPointToPathAlike( PathAlike const& pathAlike, Vec3 const& point, Mapping& mapping ) {
        PointToPathAlikeMapping< PathAlike, Mapping >::map( pathAlike, point, mapping );
    }